

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O2

void __thiscall PartVolumeButton::contextMenuEvent(PartVolumeButton *this,QContextMenuEvent *event)

{
  QAction *pQVar1;
  QKeySequence local_b0 [8];
  QArrayDataPointer<char16_t> local_a8;
  QWidgetAction volumeControlAction;
  QSlider volumeControlSlider;
  QObject local_58 [8];
  QMenu menu;
  
  event[0xc] = (QContextMenuEvent)0x1;
  QMenu::QMenu(&menu,(QWidget *)this);
  QString::QString((QString *)&volumeControlSlider,"Volume");
  pQVar1 = (QAction *)QMenu::addMenu((QString *)&menu);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&volumeControlSlider);
  QWidgetAction::QWidgetAction(&volumeControlAction,(QObject *)pQVar1);
  QSlider::QSlider(&volumeControlSlider,(QWidget *)pQVar1);
  QAbstractSlider::setRange((int)&volumeControlSlider,0);
  QAbstractSlider::setValue((int)&volumeControlSlider);
  QObject::connect(local_58,(char *)&volumeControlSlider,(QObject *)"2valueChanged(int)",
                   (char *)this,0x1722f5);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QWidgetAction::setDefaultWidget((QWidget *)&volumeControlAction);
  QWidget::addAction(pQVar1);
  QString::QString((QString *)&local_a8,"Reset Volume");
  QKeySequence::QKeySequence(local_b0);
  QMenu::addAction((QString *)&menu,(QObject *)&local_a8,(char *)this,
                   (QKeySequence *)"1handleResetVolumeTriggered()");
  QKeySequence::~QKeySequence(local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QString::QString((QString *)&local_a8,"Solo");
  QKeySequence::QKeySequence(local_b0);
  QMenu::addAction((QString *)&menu,(QObject *)&local_a8,(char *)this,
                   (QKeySequence *)"1handleSoloTriggered()");
  QKeySequence::~QKeySequence(local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QString::QString((QString *)&local_a8,"Unmute All");
  QKeySequence::QKeySequence(local_b0);
  QMenu::addAction((QString *)&menu,(QObject *)&local_a8,(char *)this,
                   (QKeySequence *)"1handleUnmuteAllTriggered()");
  QKeySequence::~QKeySequence(local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QString::QString((QString *)&local_a8,"Reset All");
  QKeySequence::QKeySequence(local_b0);
  QMenu::addAction((QString *)&menu,(QObject *)&local_a8,(char *)this,
                   (QKeySequence *)"1handleResetAllTriggered()");
  QKeySequence::~QKeySequence(local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QMenu::exec((QPoint *)&menu,(QAction *)(event + 0x30));
  QSlider::~QSlider(&volumeControlSlider);
  QWidgetAction::~QWidgetAction(&volumeControlAction);
  QMenu::~QMenu(&menu);
  return;
}

Assistant:

void PartVolumeButton::contextMenuEvent(QContextMenuEvent *event) {
	event->accept();
	QMenu menu(this);
	QMenu *volumeMenu = menu.addMenu("Volume");
	QWidgetAction volumeControlAction(volumeMenu);
	QSlider volumeControlSlider(volumeMenu);
	volumeControlSlider.setRange(0, 100);
	volumeControlSlider.setValue(qBound(0, volume, 100));
	connect(&volumeControlSlider, SIGNAL(valueChanged(int)), SLOT(handleVolumeChanged(int)));
	volumeControlAction.setDefaultWidget(&volumeControlSlider);
	volumeMenu->addAction(&volumeControlAction);
	menu.addAction("Reset Volume", this, SLOT(handleResetVolumeTriggered()));
	menu.addAction("Solo", this, SLOT(handleSoloTriggered()));
	menu.addAction("Unmute All", this, SLOT(handleUnmuteAllTriggered()));
	menu.addAction("Reset All", this, SLOT(handleResetAllTriggered()));
	menu.exec(event->globalPos());
}